

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ConstantRange>::emplaceRealloc<slang::ConstantRange>
          (SmallVectorBase<slang::ConstantRange> *this,pointer pos,ConstantRange *args)

{
  ulong uVar1;
  pointer p;
  size_type sVar2;
  pointer pCVar3;
  ConstantRange *pCVar4;
  ConstantRange *pCVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  uVar7 = this->len + 1;
  uVar1 = this->cap;
  if (uVar7 < uVar1 * 2) {
    uVar7 = uVar1 * 2;
  }
  if (0xfffffffffffffff - uVar1 < uVar1) {
    uVar7 = 0xfffffffffffffff;
  }
  lVar8 = (long)pos - (long)this->data_;
  pCVar5 = (ConstantRange *)operator_new(uVar7 * 8);
  *(ConstantRange *)((long)pCVar5 + lVar8) = *args;
  p = this->data_;
  sVar2 = this->len;
  lVar6 = (long)p + (sVar2 * 8 - (long)pos);
  pCVar3 = p;
  pCVar4 = pCVar5;
  if (lVar6 == 0) {
    if (sVar2 != 0) {
      lVar6 = 0;
      do {
        *(undefined8 *)((long)&pCVar5->left + lVar6) = *(undefined8 *)((long)&p->left + lVar6);
        lVar6 = lVar6 + 8;
      } while (sVar2 << 3 != lVar6);
    }
  }
  else {
    for (; pCVar3 != pos; pCVar3 = pCVar3 + 1) {
      *pCVar4 = *pCVar3;
      pCVar4 = pCVar4 + 1;
    }
    memcpy((void *)((long)pCVar5 + lVar8 + 8),pos,(lVar6 - 8U & 0xfffffffffffffff8) + 8);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar7;
  this->data_ = pCVar5;
  return (pointer)((long)pCVar5 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}